

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

int If_CutVerifyCuts(If_Set_t *pCutSet,int fOrdered)

{
  uint uVar1;
  If_Cut_t *p;
  If_Cut_t *pCut;
  uint uVar2;
  int iVar3;
  int local_38;
  int Value;
  int n;
  int m;
  int k;
  int i;
  If_Cut_t *pCut1;
  If_Cut_t *pCut0;
  int fOrdered_local;
  If_Set_t *pCutSet_local;
  
  if (pCutSet->nCuts < 1) {
    __assert_fail("pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                  ,0x43,"int If_CutVerifyCuts(If_Set_t *, int)");
  }
  m = 0;
  do {
    if (pCutSet->nCuts <= m) {
      return 1;
    }
    p = pCutSet->ppCuts[m];
    uVar1 = p->uSign;
    uVar2 = If_ObjCutSignCompute(p);
    if (uVar1 != uVar2) {
      __assert_fail("pCut0->uSign == If_ObjCutSignCompute(pCut0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                    ,0x47,"int If_CutVerifyCuts(If_Set_t *, int)");
    }
    if (fOrdered == 0) {
      for (Value = 0; local_38 = Value, Value < (int)(*(uint *)&p->field_0x1c >> 0x18);
          Value = Value + 1) {
        while (local_38 = local_38 + 1, local_38 < (int)(*(uint *)&p->field_0x1c >> 0x18)) {
          if ((&p[1].Area)[Value] == (&p[1].Area)[local_38]) {
            __assert_fail("pCut0->pLeaves[m] != pCut0->pLeaves[n]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                          ,0x53,"int If_CutVerifyCuts(If_Set_t *, int)");
          }
        }
      }
    }
    else {
      for (Value = 1; Value < (int)(*(uint *)&p->field_0x1c >> 0x18); Value = Value + 1) {
        if ((int)(&p[1].Area)[Value] <= (int)(&p[1].Area)[Value + -1]) {
          __assert_fail("pCut0->pLeaves[m-1] < pCut0->pLeaves[m]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                        ,0x4c,"int If_CutVerifyCuts(If_Set_t *, int)");
        }
      }
    }
    for (n = 0; n < pCutSet->nCuts; n = n + 1) {
      pCut = pCutSet->ppCuts[n];
      if (p != pCut) {
        If_CutVerifyCuts::Count = If_CutVerifyCuts::Count + 1;
        iVar3 = If_CutVerifyCut(p,pCut);
        if (iVar3 != 0) {
          uVar1 = p->uSign;
          uVar2 = If_ObjCutSignCompute(p);
          if (uVar1 != uVar2) {
            __assert_fail("pCut0->uSign == If_ObjCutSignCompute(pCut0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                          ,0x61,"int If_CutVerifyCuts(If_Set_t *, int)");
          }
          uVar1 = pCut->uSign;
          uVar2 = If_ObjCutSignCompute(pCut);
          if (uVar1 != uVar2) {
            __assert_fail("pCut1->uSign == If_ObjCutSignCompute(pCut1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                          ,0x62,"int If_CutVerifyCuts(If_Set_t *, int)");
          }
          If_CutPrint(p);
          If_CutPrint(pCut);
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                        ,0x65,"int If_CutVerifyCuts(If_Set_t *, int)");
        }
      }
    }
    m = m + 1;
  } while( true );
}

Assistant:

int If_CutVerifyCuts( If_Set_t * pCutSet, int fOrdered )
{
    static int Count = 0;
    If_Cut_t * pCut0, * pCut1; 
    int i, k, m, n, Value;
    assert( pCutSet->nCuts > 0 );
    for ( i = 0; i < pCutSet->nCuts; i++ )
    {
        pCut0 = pCutSet->ppCuts[i];
        assert( pCut0->uSign == If_ObjCutSignCompute(pCut0) );
        if ( fOrdered )
        {
            // check duplicates
            for ( m = 1; m < (int)pCut0->nLeaves; m++ )
                assert( pCut0->pLeaves[m-1] < pCut0->pLeaves[m] );
        }
        else
        {
            // check duplicates
            for ( m = 0; m < (int)pCut0->nLeaves; m++ )
            for ( n = m+1; n < (int)pCut0->nLeaves; n++ )
            assert( pCut0->pLeaves[m] != pCut0->pLeaves[n] );
        }
        // check pairs
        for ( k = 0; k < pCutSet->nCuts; k++ )
        {
            pCut1 = pCutSet->ppCuts[k];
            if ( pCut0 == pCut1 )
                continue;
            Count++;
            // check containments
            Value = If_CutVerifyCut( pCut0, pCut1 );
//            assert( Value == 0 );
            if ( Value )
            {
                assert( pCut0->uSign == If_ObjCutSignCompute(pCut0) );
                assert( pCut1->uSign == If_ObjCutSignCompute(pCut1) );
                If_CutPrint( pCut0 );
                If_CutPrint( pCut1 );
                assert( 0 );
            }
        }
    }
    return 1;
}